

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)19>_> *
vkt::anon_unknown_0::createDescriptorSetLayout
          (Move<vk::Handle<(vk::HandleType)19>_> *__return_storage_ptr__,Context *context,
          deUint32 shaderStages)

{
  VkShaderStageFlags stageFlags;
  DescriptorSetLayoutBuilder *pDVar1;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder local_68;
  deUint32 local_1c;
  Context *pCStack_18;
  deUint32 shaderStages_local;
  Context *context_local;
  
  local_1c = shaderStages;
  pCStack_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_68);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_68,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,0x10);
  stageFlags = getVkStageFlags(local_1c);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar1,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,stageFlags);
  vk = Context::getDeviceInterface(pCStack_18);
  device = Context::getDevice(pCStack_18);
  ::vk::DescriptorSetLayoutBuilder::build(__return_storage_ptr__,pDVar1,vk,device,0);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Move<vk::VkDescriptorSetLayout> createDescriptorSetLayout (Context& context, deUint32 shaderStages)
{
	DE_STATIC_ASSERT(REFERENCE_UNIFORM_BINDING	== 0);
	DE_STATIC_ASSERT(USER_UNIFORM_BINDING		== 1);

	return vk::DescriptorSetLayoutBuilder()
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, vk::VK_SHADER_STAGE_FRAGMENT_BIT)
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, getVkStageFlags(shaderStages))
				.build(context.getDeviceInterface(), context.getDevice());
}